

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall randomx::JitCompilerX86::genAddressRegDst(JitCompilerX86 *this,Instruction *instr)

{
  uint32_t uVar1;
  int iVar2;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  
  emit<2ul>(in_RSI,(uint8_t (*) [2])in_RDI);
  emitByte(in_RDI,*(char *)((long)&(in_RSI->instructionOffsets).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + 1) + 0x80);
  if (*(char *)((long)&(in_RSI->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1) == '\x04') {
    emitByte(in_RDI,'$');
  }
  uVar1 = Instruction::getImm32((Instruction *)0x151e73);
  emit32(in_RDI,uVar1);
  emitByte(in_RDI,'%');
  iVar2 = Instruction::getModCond((Instruction *)in_RSI);
  if (iVar2 < 0xe) {
    iVar2 = Instruction::getModMem((Instruction *)in_RSI);
    uVar1 = 0x3fff8;
    if (iVar2 != 0) {
      uVar1 = 0x3ff8;
    }
    emit32(in_RDI,uVar1);
  }
  else {
    emit32(in_RDI,0x1ffff8);
  }
  return;
}

Assistant:

void JitCompilerX86::genAddressRegDst(Instruction& instr) {
		emit(LEA_32);
		emitByte(0x80 + instr.dst);
		if (instr.dst == RegisterNeedsSib) {
			emitByte(0x24);
		}
		emit32(instr.getImm32());
		emitByte(AND_EAX_I);
		if (instr.getModCond() < StoreL3Condition) {
			emit32(instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
		}
		else {
			emit32(ScratchpadL3Mask);
		}
	}